

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

SteadyTimer __thiscall
miniros::NodeHandle::createSteadyTimer(NodeHandle *this,SteadyTimerOptions *ops)

{
  CallbackQueue *pCVar1;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  SteadyTimer SVar3;
  SteadyTimerOptions *in_stack_00000008;
  SteadyTimer *in_stack_00000010;
  SteadyTimer *timer;
  
  if (*(long *)(in_RDX + 0x28) == 0) {
    if (*(long *)(in_RSI + 0xa0) == 0) {
      pCVar1 = getGlobalCallbackQueue();
      *(CallbackQueue **)(in_RDX + 0x28) = pCVar1;
    }
    else {
      *(undefined8 *)(in_RDX + 0x28) = *(undefined8 *)(in_RSI + 0xa0);
    }
  }
  SteadyTimer::SteadyTimer(in_stack_00000010,in_stack_00000008);
  _Var2._M_pi = extraout_RDX;
  if ((*(byte *)(in_RDX + 0x41) & 1) != 0) {
    SteadyTimer::start((SteadyTimer *)in_RDI);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (SteadyTimer)
         SVar3.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SteadyTimer NodeHandle::createSteadyTimer(SteadyTimerOptions& ops) const
{
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  SteadyTimer timer(ops);
  if (ops.autostart)
    timer.start();
  return timer;
}